

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O0

char * __thiscall SimpleStringInternalCache::alloc(SimpleStringInternalCache *this,size_t size)

{
  bool bVar1;
  SimpleStringInternalCacheNode *pSVar2;
  SimpleStringMemoryBlock *pSVar3;
  size_t size_local;
  SimpleStringInternalCache *this_local;
  
  bVar1 = isCached(this,size);
  if (bVar1) {
    bVar1 = hasFreeBlocksOfSize(this,size);
    if (bVar1) {
      pSVar2 = getCacheNodeFromSize(this,size);
      pSVar3 = reserveCachedBlockFrom(this,pSVar2);
      this_local = (SimpleStringInternalCache *)pSVar3->memory_;
    }
    else {
      pSVar2 = getCacheNodeFromSize(this,size);
      pSVar3 = allocateNewCacheBlockFrom(this,pSVar2);
      this_local = (SimpleStringInternalCache *)pSVar3->memory_;
    }
  }
  else {
    pSVar3 = createSimpleStringMemoryBlock(this,size,this->nonCachedAllocations_);
    this->nonCachedAllocations_ = pSVar3;
    this_local = (SimpleStringInternalCache *)this->nonCachedAllocations_->memory_;
  }
  return (char *)this_local;
}

Assistant:

char* SimpleStringInternalCache::alloc(size_t size)
{
    if (isCached(size)) {
        if (hasFreeBlocksOfSize(size))
            return reserveCachedBlockFrom(getCacheNodeFromSize(size))->memory_;
        else
            return allocateNewCacheBlockFrom(getCacheNodeFromSize(size))->memory_;
    }

    nonCachedAllocations_ = createSimpleStringMemoryBlock(size, nonCachedAllocations_);
    return nonCachedAllocations_->memory_;
}